

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O3

CURLcode curl_mime_headers(curl_mimepart *part,curl_slist *headers,int take_ownership)

{
  uint uVar1;
  
  if (part != (curl_mimepart *)0x0) {
    uVar1 = part->flags;
    if ((uVar1 & 1) != 0) {
      if (part->userheaders != headers) {
        curl_slist_free_all(part->userheaders);
        uVar1 = part->flags;
      }
      uVar1 = uVar1 & 0xfffffffe;
      part->flags = uVar1;
    }
    part->userheaders = headers;
    if (take_ownership != 0 && headers != (curl_slist *)0x0) {
      part->flags = uVar1 | 1;
    }
    return CURLE_OK;
  }
  return CURLE_BAD_FUNCTION_ARGUMENT;
}

Assistant:

CURLcode curl_mime_headers(curl_mimepart *part,
                           struct curl_slist *headers, int take_ownership)
{
  if(!part)
    return CURLE_BAD_FUNCTION_ARGUMENT;

  if(part->flags & MIME_USERHEADERS_OWNER) {
    if(part->userheaders != headers)  /* Allow setting twice the same list. */
      curl_slist_free_all(part->userheaders);
    part->flags &= ~MIME_USERHEADERS_OWNER;
  }
  part->userheaders = headers;
  if(headers && take_ownership)
    part->flags |= MIME_USERHEADERS_OWNER;
  return CURLE_OK;
}